

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QMap<QString,_QVariant>_>::relocate
          (QArrayDataPointer<QMap<QString,_QVariant>_> *this,qsizetype offset,
          QMap<QString,_QVariant> **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QMap<QString,_QVariant>_> *in_RDI;
  QMap<QString,_QVariant> **unaff_retaddr;
  QMap<QString,_QVariant> *res;
  QMap<QString,_QVariant> *first;
  QArrayDataPointer<QMap<QString,_QVariant>_> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QMap<QString,QVariant>,long_long>
            (first,(longlong)in_RDI,(QMap<QString,_QVariant> *)0x14e1b7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QMap<QString,QVariant>>,QMap<QString,QVariant>const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }